

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

bool __thiscall anon_unknown.dwarf_eb8f1::pp_lifo::emplace(pp_lifo *this,int variable,bool value)

{
  pointer this_00;
  ulong uVar1;
  pointer ppVar2;
  long lVar3;
  pointer ppVar4;
  undefined7 in_register_00000011;
  size_t __n;
  size_t extraout_RDX;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t __n_00;
  
  __n = CONCAT71(in_register_00000011,value);
  ppVar2 = (this->data).
           super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = (this->data).
            super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
            ._M_impl.super__Vector_impl_data._M_start;
  __n_00 = (long)ppVar2 - (long)this_00;
  lVar6 = 0x18;
  lVar8 = 0;
  for (lVar3 = (long)__n_00 >> 5; 0 < lVar3; lVar3 = lVar3 + -1) {
    if (*(int *)((long)&(((_Vector_impl *)&this_00[-3].index)->super__Vector_impl_data)._M_start +
                lVar6) == variable) {
      ppVar4 = (pointer)((long)this_00 - lVar8);
      goto LAB_00121a65;
    }
    if (*(int *)((long)&this_00[-2].index + lVar6) == variable) {
      ppVar4 = (pointer)((long)this_00 + (8 - lVar8));
      goto LAB_00121a65;
    }
    if (*(int *)((long)&this_00[-1].index + lVar6) == variable) {
      ppVar4 = (pointer)((long)this_00 + (0x10 - lVar8));
      goto LAB_00121a65;
    }
    if (*(int *)((long)&(((_Vector_impl *)&this_00->index)->super__Vector_impl_data)._M_start +
                lVar6) == variable) {
      ppVar4 = (pointer)((long)this_00 + (0x18 - lVar8));
      goto LAB_00121a65;
    }
    lVar8 = lVar8 + -0x20;
    lVar6 = lVar6 + 0x20;
  }
  ppVar4 = (pointer)((long)this_00 - lVar8);
  lVar3 = (long)(__n_00 + lVar8) >> 3;
  if (lVar3 == 3) {
    if (*(int *)((long)&(((_Vector_impl *)&this_00[-3].index)->super__Vector_impl_data)._M_start +
                lVar6) != variable) {
      ppVar4 = (pointer)((long)this_00 + (8 - lVar8));
      goto LAB_00121a55;
    }
LAB_00121a65:
    if (ppVar4 != ppVar2) goto LAB_00121b34;
  }
  else {
    if (lVar3 == 2) {
LAB_00121a55:
      if (*(int *)&(((_Vector_impl *)&ppVar4->index)->super__Vector_impl_data)._M_start != variable)
      {
        ppVar4 = ppVar4 + 1;
        goto LAB_00121a5e;
      }
      goto LAB_00121a65;
    }
    if (lVar3 == 1) {
LAB_00121a5e:
      if (*(int *)&(((_Vector_impl *)&ppVar4->index)->super__Vector_impl_data)._M_start != variable)
      {
        ppVar4 = ppVar2;
      }
      goto LAB_00121a65;
    }
  }
  if (ppVar2 == (this->data).
                super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    if (__n_00 == 0x7ffffffffffffff8) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar5 = (long)__n_00 >> 3;
    uVar1 = 1;
    if (ppVar2 != this_00) {
      uVar1 = uVar5;
    }
    uVar7 = uVar1 + uVar5;
    if (0xffffffffffffffe < uVar7) {
      uVar7 = 0xfffffffffffffff;
    }
    if (CARRY8(uVar1,uVar5)) {
      uVar7 = 0xfffffffffffffff;
    }
    if (uVar7 == 0) {
      ppVar2 = (pointer)0x0;
    }
    else {
      __n = __n & 0xffffffff;
      ppVar2 = (pointer)operator_new(uVar7 * 8);
    }
    ppVar2[uVar5].index = variable;
    ppVar2[uVar5].value = SUB81(__n,0);
    if (0 < (long)__n_00) {
      memmove(ppVar2,this_00,__n_00);
      __n = extraout_RDX;
    }
    std::
    _Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ::_M_deallocate((_Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
                     *)this_00,
                    (pointer)((long)(this->data).
                                    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)this_00 >> 3),__n);
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar2;
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppVar2 + __n_00 + 8);
    ppVar2 = ppVar2 + uVar7;
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar2;
  }
  else {
    *(int *)&(((_Vector_impl *)&ppVar2->index)->super__Vector_impl_data)._M_start = variable;
    ppVar2->value = value;
    ppVar2 = ppVar2 + 1;
    (this->data).
    super__Vector_base<(anonymous_namespace)::pp_variable_value,_std::allocator<(anonymous_namespace)::pp_variable_value>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
  }
LAB_00121b34:
  return SUB81(ppVar2,0);
}

Assistant:

bool emplace(int variable, bool value)
    {
        auto it = std::find_if(
          data.cbegin(), data.cend(), [&variable](const auto& elem) {
              return elem.index == variable;
          });

        if (it != data.cend())
            return false;

        data.emplace_back(variable, value);

        return true;
    }